

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall cmMakefile::FindTargetToUse(cmMakefile *this,string *name,bool excludeAliases)

{
  bool bVar1;
  pointer pvVar2;
  cmGlobalGenerator *this_00;
  cmTarget *t;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
  local_30;
  const_iterator imported;
  bool excludeAliases_local;
  string *name_local;
  cmMakefile *this_local;
  
  imported.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
  ._M_cur._7_1_ = excludeAliases;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
       ::find(&this->ImportedTargets,name);
  t = (cmTarget *)
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
      ::end(&this->ImportedTargets);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
                      *)&t);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
                           *)&local_30);
    this_local = (cmMakefile *)pvVar2->second;
  }
  else {
    this_local = (cmMakefile *)
                 FindTarget(this,name,
                            (bool)(imported.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
                                   ._M_cur._7_1_ & 1));
    if (this_local == (cmMakefile *)0x0) {
      this_00 = GetGlobalGenerator(this);
      this_local = (cmMakefile *)
                   cmGlobalGenerator::FindTarget
                             (this_00,name,
                              (bool)(imported.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
                                     ._M_cur._7_1_ & 1));
    }
  }
  return (cmTarget *)this_local;
}

Assistant:

cmTarget* cmMakefile::FindTargetToUse(const std::string& name,
                                      bool excludeAliases) const
{
  // Look for an imported target.  These take priority because they
  // are more local in scope and do not have to be globally unique.
  TargetMap::const_iterator
    imported = this->ImportedTargets.find(name);
  if(imported != this->ImportedTargets.end())
    {
    return imported->second;
    }

  // Look for a target built in this directory.
  if(cmTarget* t = this->FindTarget(name, excludeAliases))
    {
    return t;
    }

  // Look for a target built in this project.
  return this->GetGlobalGenerator()->FindTarget(name, excludeAliases);
}